

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

JavascriptSharedArrayBuffer *
Js::JavascriptSharedArrayBuffer::Create(uint32 length,DynamicType *type)

{
  ScriptContext *this;
  Recycler *pRVar1;
  SharedArrayBuffer *this_00;
  TrackAllocData local_50;
  SharedArrayBuffer *local_28;
  JavascriptSharedArrayBuffer *result;
  Recycler *recycler;
  DynamicType *type_local;
  uint32 length_local;
  
  recycler = (Recycler *)type;
  type_local._4_4_ = length;
  this = Js::Type::GetScriptContext(&type->super_Type);
  pRVar1 = ScriptContext::GetRecycler(this);
  result = (JavascriptSharedArrayBuffer *)pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
             ,0x1a3);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this_00 = (SharedArrayBuffer *)new<Memory::Recycler>(0x30,pRVar1,0x4642b0);
  JavascriptSharedArrayBuffer((JavascriptSharedArrayBuffer *)this_00,(DynamicType *)recycler);
  local_28 = this_00;
  SharedArrayBuffer::Init(this_00,type_local._4_4_,type_local._4_4_);
  Memory::Recycler::AddExternalMemoryUsage((Recycler *)result,(ulong)type_local._4_4_);
  return (JavascriptSharedArrayBuffer *)local_28;
}

Assistant:

JavascriptSharedArrayBuffer* JavascriptSharedArrayBuffer::Create(uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        JavascriptSharedArrayBuffer* result = RecyclerNewFinalized(recycler, JavascriptSharedArrayBuffer, type);
        result->Init(length, length);
        recycler->AddExternalMemoryUsage(length);
        return result;
    }